

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  uint uVar1;
  ushort uVar2;
  ma_uint64 mVar3;
  ma_uint64 in_RDX;
  ma_dr_wav *in_RSI;
  long in_RDI;
  ma_uint64 framesRead;
  ma_uint64 iSample;
  anon_union_4_2_947300a4 x;
  float *in_stack_ffffffffffffffb8;
  undefined8 local_28;
  
  mVar3 = ma_dr_wav_read_pcm_frames_f32(in_RSI,in_RDX,in_stack_ffffffffffffffb8);
  if (in_RDX != 0) {
    uVar2 = *(ushort *)(in_RDI + 0x70);
    for (local_28 = 0; local_28 < mVar3 * uVar2; local_28 = local_28 + 1) {
      uVar1 = *(uint *)(in_RDX + local_28 * 4);
      *(uint *)(in_RDX + local_28 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_f32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_f32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}